

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::sectionEnded(RunContext *this,SectionEndInfo *endInfo)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  IStreamingReporter *pIVar3;
  bool _missingAssertions;
  SectionStats local_d8;
  undefined1 local_40 [8];
  Counts assertions;
  
  local_40 = (undefined1  [8])
             ((this->m_totals).assertions.passed - (endInfo->prevAssertions).passed);
  assertions.passed = (this->m_totals).assertions.failed - (endInfo->prevAssertions).failed;
  assertions.failed =
       (this->m_totals).assertions.failedButOk - (endInfo->prevAssertions).failedButOk;
  _missingAssertions = testForMissingAssertions(this,(Counts *)local_40);
  ppIVar2 = (this->m_activeSections).
            super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_activeSections).
      super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
      ._M_impl.super__Vector_impl_data._M_start != ppIVar2) {
    (*(ppIVar2[-1]->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[10])();
    pppIVar1 = &(this->m_activeSections).
                super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + -1;
  }
  pIVar3 = (this->m_reporter).m_p;
  SectionStats::SectionStats
            (&local_d8,&endInfo->sectionInfo,(Counts *)local_40,endInfo->durationInSeconds,
             _missingAssertions);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,&local_d8);
  SectionStats::~SectionStats(&local_d8);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  return;
}

Assistant:

virtual void sectionEnded(SectionEndInfo const& endInfo) {
			Counts assertions = m_totals.assertions - endInfo.prevAssertions;
			bool missingAssertions = testForMissingAssertions(assertions);

			if (!m_activeSections.empty()) {
				m_activeSections.back()->close();
				m_activeSections.pop_back();
			}

			m_reporter->sectionEnded(SectionStats(endInfo.sectionInfo, assertions, endInfo.durationInSeconds, missingAssertions));
			m_messages.clear();
		}